

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O0

void Hop_Transfer_rec(Hop_Man_t *pDest,Hop_Obj_t *pObj)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *p1;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *pDest_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopDfs.c"
                  ,0x14c,"void Hop_Transfer_rec(Hop_Man_t *, Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Hop_ObjIsMarkA(pObj), iVar1 == 0)) {
    pHVar2 = Hop_ObjFanin0(pObj);
    Hop_Transfer_rec(pDest,pHVar2);
    pHVar2 = Hop_ObjFanin1(pObj);
    Hop_Transfer_rec(pDest,pHVar2);
    pHVar2 = Hop_ObjChild0Copy(pObj);
    p1 = Hop_ObjChild1Copy(pObj);
    pHVar2 = Hop_And(pDest,pHVar2,p1);
    (pObj->field_0).pData = pHVar2;
    iVar1 = Hop_ObjIsMarkA(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopDfs.c"
                    ,0x152,"void Hop_Transfer_rec(Hop_Man_t *, Hop_Obj_t *)");
    }
    Hop_ObjSetMarkA(pObj);
  }
  return;
}

Assistant:

void Hop_Transfer_rec( Hop_Man_t * pDest, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Hop_Transfer_rec( pDest, Hop_ObjFanin0(pObj) ); 
    Hop_Transfer_rec( pDest, Hop_ObjFanin1(pObj) );
    pObj->pData = Hop_And( pDest, Hop_ObjChild0Copy(pObj), Hop_ObjChild1Copy(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}